

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint16_t bitset_container_minimum(bitset_container_t *container)

{
  ulong uVar1;
  short sVar2;
  int r;
  uint64_t w;
  int32_t i;
  bitset_container_t *container_local;
  
  w._4_4_ = 0;
  while( true ) {
    if (0x3ff < w._4_4_) {
      return 0xffff;
    }
    uVar1 = container->words[w._4_4_];
    if (uVar1 != 0) break;
    w._4_4_ = w._4_4_ + 1;
  }
  sVar2 = 0;
  for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
    sVar2 = sVar2 + 1;
  }
  return sVar2 + (short)(w._4_4_ << 6);
}

Assistant:

uint16_t bitset_container_minimum(const bitset_container_t *container) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = __builtin_ctzll(w);
      return r + i * 64;
    }
  }
  return UINT16_MAX;
}